

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadBranchElimPass::MarkLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks)

{
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *ppVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var2;
  _Hash_node_base this_00;
  pointer pOVar3;
  uint **ppuVar4;
  _Hash_node_base *p_Var5;
  DebugScope DVar6;
  IRContext *this_01;
  StructuredCFGAnalysis *pSVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t merge_id;
  iterator iVar13;
  iterator iVar14;
  uint **ppuVar15;
  pointer pOVar16;
  uint uVar17;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar18;
  uint32_t live_lab_id;
  BasicBlock *block;
  bool condVal;
  uint32_t icnt;
  uint32_t sel_val;
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  conditions_to_simplify;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> stack;
  uint32_t case_val;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  blocks_with_backedge;
  uint32_t local_ec;
  DebugScope local_e8;
  _Any_data local_e0;
  code *local_d0;
  code *local_c8;
  undefined1 local_c0 [8];
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *local_b8;
  iterator iStack_b0;
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *local_a8;
  Function *local_98;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Stack_90;
  Instruction *local_88;
  IRContext *local_78;
  undefined1 local_6c [12];
  IRContext *local_60;
  __node_base local_58;
  pointer pOStack_50;
  float local_48;
  pointer local_40;
  pointer pIStack_38;
  
  local_b8 = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  iStack_b0._M_current = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  bVar8 = false;
  local_a8 = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  local_6c._4_8_ = &pIStack_38;
  local_60 = (IRContext *)0x1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  pOStack_50 = (pointer)0x0;
  local_48 = 1.0;
  local_40 = (pointer)0x0;
  pIStack_38 = (pointer)0x0;
  local_88 = (Instruction *)0x0;
  local_98 = (Function *)0x0;
  _Stack_90._M_head_impl = (Instruction *)0x0;
  local_e0._M_unused._0_8_ =
       (undefined8)
       (((func->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
             &local_98,(BasicBlock **)&local_e0);
  if (local_98 != (Function *)_Stack_90._M_head_impl) {
    do {
      local_e8 = *(DebugScope *)((long)_Stack_90._M_head_impl + -8);
      _Stack_90._M_head_impl = _Stack_90._M_head_impl + -8;
      local_e0._M_unused._M_object = live_blocks;
      pVar18 = std::
               _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                         ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)live_blocks,&local_e8,&local_e0);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar11 = BasicBlock::ContinueBlockIdIfAny((BasicBlock *)local_e8);
        if (uVar11 != 0) {
          _Var2._M_head_impl =
               (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)((long)local_e8 + 8))->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar12 = 0;
          if ((_Var2._M_head_impl)->has_result_id_ == true) {
            uVar12 = Instruction::GetSingleWordOperand
                               (_Var2._M_head_impl,(uint)(_Var2._M_head_impl)->has_type_id_);
          }
          merge_id = BasicBlock::MergeBlockIdIfAny((BasicBlock *)local_e8);
          AddBlocksWithBackEdge
                    (this,uVar11,uVar12,merge_id,
                     (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)(local_6c + 4));
        }
        if ((*(_Hash_node_base **)((long)local_e8 + 0x20) == (_Hash_node_base *)0x0) ||
           (*(char *)&(*(_Hash_node_base **)((long)local_e8 + 0x20))[3]._M_nxt != '\0')) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        this_00._M_nxt = *(_Hash_node_base **)((long)local_e8 + 0x28);
        local_ec = 0;
        if (*(Op *)(this_00._M_nxt + 5) == OpBranchConditional) {
          uVar11 = (*(bool *)((long)(this_00._M_nxt + 5) + 5) & 1) + 1;
          if (*(bool *)((long)(this_00._M_nxt + 5) + 4) == false) {
            uVar11 = (uint)*(bool *)((long)(this_00._M_nxt + 5) + 5);
          }
          uVar11 = Instruction::GetSingleWordOperand((Instruction *)this_00._M_nxt,uVar11);
          bVar8 = GetConstCondition(this,uVar11,(bool *)local_e0._M_pod_data);
          if (bVar8) {
            uVar17 = (*(bool *)((long)(this_00._M_nxt + 5) + 5) & 1) + 1;
            if (*(bool *)((long)(this_00._M_nxt + 5) + 4) == false) {
              uVar17 = (uint)*(bool *)((long)(this_00._M_nxt + 5) + 5);
            }
            local_ec = Instruction::GetSingleWordOperand
                                 ((Instruction *)this_00._M_nxt,
                                  (uVar17 - (byte)local_e0._M_pod_data[0]) + 2);
          }
LAB_0054d637:
          if (local_ec != 0) {
            uVar11 = local_ec;
            if (*(__node_base_ptr *)(local_6c._4_8_ + ((ulong)local_e8 % (ulong)local_60) * 8) !=
                (__node_base_ptr)0x0) {
              p_Var5 = (*(__node_base_ptr *)
                         (local_6c._4_8_ + ((ulong)local_e8 % (ulong)local_60) * 8))->_M_nxt;
              DVar6 = (DebugScope)p_Var5[1]._M_nxt;
              while (local_e8 != DVar6) {
                p_Var5 = p_Var5->_M_nxt;
                if ((p_Var5 == (_Hash_node_base *)0x0) ||
                   (DVar6 = (DebugScope)p_Var5[1]._M_nxt,
                   (ulong)DVar6 % (ulong)local_60 != (ulong)local_e8 % (ulong)local_60))
                goto LAB_0054d6fe;
              }
              this_01 = (this->super_MemPass).super_Pass.context_;
              if ((this_01->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
                IRContext::BuildStructuredCFGAnalysis(this_01);
              }
              pSVar7 = (this_01->struct_cfg_analysis_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                       .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>.
                       _M_head_impl;
              _Var2._M_head_impl =
                   (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)((long)local_e8 + 8))->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
              uVar11 = 0;
              uVar12 = 0;
              if ((_Var2._M_head_impl)->has_result_id_ == true) {
                uVar12 = Instruction::GetSingleWordOperand
                                   (_Var2._M_head_impl,(uint)(_Var2._M_head_impl)->has_type_id_);
              }
              local_e0._0_4_ = uVar12;
              iVar13 = std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&(pSVar7->bb_to_construct_)._M_h,
                              (key_type_conflict *)local_e0._M_pod_data);
              if (iVar13.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                  ._M_cur != (__node_type *)0x0) {
                uVar11 = *(uint32_t *)
                          ((long)iVar13.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                                 ._M_cur + 0x10);
              }
              if (local_ec != uVar11) goto LAB_0054d729;
            }
LAB_0054d6fe:
            local_e0._8_4_ = uVar11;
            local_e0._M_unused._0_8_ = local_e8;
            if (iStack_b0._M_current == local_a8) {
              std::
              vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
              ::_M_realloc_insert<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>
                        ((vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
                          *)&local_b8,iStack_b0,
                         (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)&local_e0);
              uVar11 = local_ec;
            }
            else {
              (iStack_b0._M_current)->first = (BasicBlock *)local_e8;
              *(undefined8 *)&(iStack_b0._M_current)->second = local_e0._8_8_;
              iStack_b0._M_current = iStack_b0._M_current + 1;
            }
            local_e0._M_unused._M_object = GetParentBlock(this,uVar11);
            std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
            emplace_back<spvtools::opt::BasicBlock*>
                      ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                        *)&local_98,(BasicBlock **)&local_e0);
            goto LAB_0054d7a0;
          }
        }
        else if (*(Op *)(this_00._M_nxt + 5) == OpSwitch) {
          uVar11 = (*(bool *)((long)(this_00._M_nxt + 5) + 5) & 1) + 1;
          if (*(bool *)((long)(this_00._M_nxt + 5) + 4) == false) {
            uVar11 = (uint)*(bool *)((long)(this_00._M_nxt + 5) + 5);
          }
          uVar11 = Instruction::GetSingleWordOperand((Instruction *)this_00._M_nxt,uVar11);
          bVar8 = GetConstInteger(this,uVar11,(uint32_t *)(local_c0 + 4));
          if (bVar8) {
            local_c0._0_4_ = 0;
            local_e0._8_8_ = (DeadBranchElimPass *)0x0;
            local_e0._M_unused._M_object = operator_new(0x20);
            ((BasicBlock *)local_e0._M_unused._0_8_)->function_ = (Function *)local_c0;
            (((BasicBlock *)local_e0._M_unused._0_8_)->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
                 (Instruction *)local_6c;
            (((BasicBlock *)local_e0._M_unused._0_8_)->insts_).
            super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
                 (_func_int **)(local_c0 + 4);
            (((BasicBlock *)local_e0._M_unused._0_8_)->insts_).
            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
                 (_func_int **)&local_ec;
            local_c8 = std::
                       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                       ::_M_invoke;
            local_d0 = std::
                       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                       ::_M_manager;
            pOVar16 = (((OperandList *)(this_00._M_nxt + 7))->
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pOVar3 = *(pointer *)(this_00._M_nxt + 8);
            if (pOVar16 != pOVar3) {
              do {
                if ((pOVar16->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                  ppuVar4 = (uint **)(pOVar16->words).large_data_._M_t.
                                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                     ._M_head_impl;
                  ppuVar15 = &(pOVar16->words).small_data_;
                  if (ppuVar4 != (uint **)0x0) {
                    ppuVar15 = ppuVar4;
                  }
                  local_78 = (IRContext *)*ppuVar15;
                  if (local_d0 == (code *)0x0) {
                    std::__throw_bad_function_call();
                  }
                  cVar9 = (*local_c8)(&local_e0,(uint *)&local_78);
                  if (cVar9 == '\0') break;
                }
                pOVar16 = pOVar16 + 1;
              } while (pOVar16 != pOVar3);
              if (local_d0 == (code *)0x0) goto LAB_0054d637;
            }
            (*local_d0)(&local_e0,&local_e0,__destroy_functor);
          }
          goto LAB_0054d637;
        }
LAB_0054d729:
        local_e0._M_unused._M_object = &local_98;
        local_c8 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                   ::_M_invoke;
        local_d0 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                   ::_M_manager;
        local_e0._8_8_ = this;
        BasicBlock::ForEachSuccessorLabel
                  ((BasicBlock *)local_e8,(function<void_(unsigned_int)> *)&local_e0);
        if (local_d0 != (code *)0x0) {
          (*local_d0)(&local_e0,&local_e0,__destroy_functor);
        }
      }
LAB_0054d7a0:
    } while (local_98 != (Function *)_Stack_90._M_head_impl);
    if (iStack_b0._M_current == local_b8) {
      bVar8 = false;
    }
    else {
      bVar8 = false;
      iVar14._M_current = iStack_b0._M_current;
      do {
        ppVar1 = iVar14._M_current + -1;
        bVar10 = SimplifyBranch(this,iVar14._M_current[-1].first,iVar14._M_current[-1].second);
        bVar8 = (bool)(bVar8 | bVar10);
        iVar14._M_current = ppVar1;
      } while (ppVar1 != local_b8);
    }
  }
  if (local_98 != (Function *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_6c + 4));
  if (local_b8 != (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return bVar8;
}

Assistant:

bool DeadBranchElimPass::MarkLiveBlocks(
    Function* func, std::unordered_set<BasicBlock*>* live_blocks) {
  std::vector<std::pair<BasicBlock*, uint32_t>> conditions_to_simplify;
  std::unordered_set<BasicBlock*> blocks_with_backedge;
  std::vector<BasicBlock*> stack;
  stack.push_back(&*func->begin());
  bool modified = false;
  while (!stack.empty()) {
    BasicBlock* block = stack.back();
    stack.pop_back();

    // Live blocks doubles as visited set.
    if (!live_blocks->insert(block).second) continue;

    uint32_t cont_id = block->ContinueBlockIdIfAny();
    if (cont_id != 0) {
      AddBlocksWithBackEdge(cont_id, block->id(), block->MergeBlockIdIfAny(),
                            &blocks_with_backedge);
    }

    Instruction* terminator = block->terminator();
    uint32_t live_lab_id = 0;
    // Check if the terminator has a single valid successor.
    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      bool condVal;
      if (GetConstCondition(terminator->GetSingleWordInOperand(0u), &condVal)) {
        live_lab_id = terminator->GetSingleWordInOperand(
            condVal ? kBranchCondTrueLabIdInIdx : kBranchCondFalseLabIdInIdx);
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      uint32_t sel_val;
      if (GetConstInteger(terminator->GetSingleWordInOperand(0u), &sel_val)) {
        // Search switch operands for selector value, set live_lab_id to
        // corresponding label, use default if not found.
        uint32_t icnt = 0;
        uint32_t case_val;
        terminator->WhileEachInOperand(
            [&icnt, &case_val, &sel_val, &live_lab_id](const uint32_t* idp) {
              if (icnt == 1) {
                // Start with default label.
                live_lab_id = *idp;
              } else if (icnt > 1) {
                if (icnt % 2 == 0) {
                  case_val = *idp;
                } else {
                  if (case_val == sel_val) {
                    live_lab_id = *idp;
                    return false;
                  }
                }
              }
              ++icnt;
              return true;
            });
      }
    }

    // Don't simplify back edges unless it becomes a branch to the header. Every
    // loop must have exactly one back edge to the loop header, so we cannot
    // remove it.
    bool simplify = false;
    if (live_lab_id != 0) {
      if (!blocks_with_backedge.count(block)) {
        // This is not a back edge.
        simplify = true;
      } else {
        const auto& struct_cfg_analysis = context()->GetStructuredCFGAnalysis();
        uint32_t header_id = struct_cfg_analysis->ContainingLoop(block->id());
        if (live_lab_id == header_id) {
          // The new branch will be a branch to the header.
          simplify = true;
        }
      }
    }

    if (simplify) {
      conditions_to_simplify.push_back({block, live_lab_id});
      stack.push_back(GetParentBlock(live_lab_id));
    } else {
      // All successors are live.
      const auto* const_block = block;
      const_block->ForEachSuccessorLabel([&stack, this](const uint32_t label) {
        stack.push_back(GetParentBlock(label));
      });
    }
  }

  // Traverse |conditions_to_simplify| in reverse order.  This is done so that
  // we simplify nested constructs before simplifying the constructs that
  // contain them.
  for (auto b = conditions_to_simplify.rbegin();
       b != conditions_to_simplify.rend(); ++b) {
    modified |= SimplifyBranch(b->first, b->second);
  }

  return modified;
}